

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

int mdns_discovery_send(int sock)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  sockaddr_storage addr_storage;
  socklen_t local_a8;
  sockaddr local_a4;
  undefined4 uStack_94;
  undefined8 local_90;
  sockaddr local_88 [8];
  
  local_a8 = 0x80;
  iVar1 = getsockname(sock,local_88,&local_a8);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (local_88[0].sa_family == 10) {
      local_a4.sa_data[2] = '\0';
      local_a4.sa_data[3] = '\0';
      local_a4.sa_data[4] = '\0';
      local_a4.sa_data[5] = '\0';
      uStack_94 = 0;
      local_a4.sa_family = 10;
      local_a4.sa_data[6] = -1;
      local_a4.sa_data[7] = '\x02';
      local_90 = 0xfb000000;
      local_a8 = 0x1c;
    }
    else {
      local_a4.sa_data[6] = '\0';
      local_a4.sa_data[7] = '\0';
      local_a4.sa_family = 2;
      local_a4.sa_data[2] = -0x20;
      local_a4.sa_data[3] = '\0';
      local_a4.sa_data[4] = '\0';
      local_a4.sa_data[5] = -5;
      local_a8 = 0x10;
    }
    local_a4.sa_data[10] = '\0';
    local_a4.sa_data[0xb] = '\0';
    local_a4.sa_data[0xc] = '\0';
    local_a4.sa_data[0xd] = '\0';
    local_a4.sa_data[8] = '\0';
    local_a4.sa_data[9] = '\0';
    local_a4.sa_data[0] = '\x14';
    local_a4.sa_data[1] = -0x17;
    sVar3 = sendto(sock,"",0x2e,0,&local_a4,local_a8);
    iVar2 = (int)(sVar3 >> 0x3f);
  }
  return iVar2;
}

Assistant:

int
mdns_discovery_send(int sock) {
	struct sockaddr_storage addr_storage;
	struct sockaddr_in addr;
	struct sockaddr_in6 addr6;
	struct sockaddr* saddr = (struct sockaddr*)&addr_storage;
	socklen_t saddrlen = sizeof(struct sockaddr_storage);
	if (getsockname(sock, saddr, &saddrlen))
		return -1;
	if (saddr->sa_family == AF_INET6) {
		memset(&addr6, 0, sizeof(struct sockaddr_in6));
		addr6.sin6_family = AF_INET6;
#ifdef __APPLE__
		addr6.sin6_len = sizeof(struct sockaddr_in6);
#endif
		addr6.sin6_addr.s6_addr[0] = 0xFF;
		addr6.sin6_addr.s6_addr[1] = 0x02;
		addr6.sin6_addr.s6_addr[15] = 0xFB;
		addr6.sin6_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr6;
		saddrlen = sizeof(struct sockaddr_in6);
	}
	else {
		memset(&addr, 0, sizeof(struct sockaddr_in));
		addr.sin_family = AF_INET;
#ifdef __APPLE__
		addr.sin_len = sizeof(struct sockaddr_in);
#endif
		addr.sin_addr.s_addr = htonl((((uint32_t)224U) << 24U) | ((uint32_t)251U));
		addr.sin_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr;
		saddrlen = sizeof(struct sockaddr_in);
	}

	if (sendto(sock, mdns_services_query, sizeof(mdns_services_query), 0,
	           saddr, saddrlen) < 0)
		return -1;
	return 0;
}